

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManPrintNodeProfile(int *pCounts,int nSizeMax)

{
  uint local_2c;
  uint local_20;
  int local_1c;
  int NodeAll;
  int SizeAll;
  int i;
  int nSizeMax_local;
  int *pCounts_local;
  
  local_1c = 0;
  local_20 = 0;
  for (NodeAll = 0; NodeAll <= nSizeMax; NodeAll = NodeAll + 1) {
    local_1c = NodeAll * pCounts[NodeAll] + local_1c;
    local_20 = pCounts[NodeAll] + local_20;
  }
  Abc_Print(1,"LUT = %d : ",(ulong)local_20);
  for (NodeAll = 2; NodeAll <= nSizeMax; NodeAll = NodeAll + 1) {
    Abc_Print(1,"%d=%d %.1f %%  ",((double)pCounts[NodeAll] * 100.0) / (double)(int)local_20,
              (ulong)(uint)NodeAll,(ulong)(uint)pCounts[NodeAll]);
  }
  if (local_20 == 0) {
    local_2c = 1;
  }
  else {
    local_2c = local_20;
  }
  Abc_Print(1,"Ave = %.2f\n",((double)local_1c * 1.0) / (double)(int)local_2c);
  return;
}

Assistant:

void Gia_ManPrintNodeProfile( int * pCounts, int nSizeMax )
{
    int i, SizeAll = 0, NodeAll = 0;
    for ( i = 0; i <= nSizeMax; i++ )
    {
        SizeAll += i * pCounts[i];
        NodeAll += pCounts[i];
    }
    Abc_Print( 1, "LUT = %d : ", NodeAll );
    for ( i = 2; i <= nSizeMax; i++ )
        Abc_Print( 1, "%d=%d %.1f %%  ", i, pCounts[i], 100.0*pCounts[i]/NodeAll );
    Abc_Print( 1, "Ave = %.2f\n", 1.0*SizeAll/(NodeAll ? NodeAll : 1) );
}